

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,char *moduleId,
          IOTHUB_MODULE *module)

{
  LOGGER_LOG p_Var1;
  undefined1 local_e0 [8];
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_MODULE *module_local;
  char *moduleId_local;
  char *deviceId_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if ((((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) || (deviceId == (char *)0x0))
      || (moduleId == (char *)0x0)) || (module == (IOTHUB_MODULE *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetModule",0x7a3,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((module->version < 1) || (1 < module->version)) {
    deviceOrModuleInfo.managedBy = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)deviceOrModuleInfo.managedBy != (LOGGER_LOG)0x0) {
      (*(code *)deviceOrModuleInfo.managedBy)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                 ,"IoTHubRegistryManager_GetModule",0x7a8,1,"module must have a valid version");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
  }
  else {
    l._4_4_ = IoTHubRegistryManager_GetDeviceOrModule
                        (registryManagerHandle,deviceId,moduleId,(IOTHUB_DEVICE_OR_MODULE *)local_e0
                        );
    if (deviceOrModuleInfo._136_8_ == 0) {
      l._4_4_ = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
    }
    else if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
      move_deviceOrModule_members_to_module((IOTHUB_DEVICE_OR_MODULE *)local_e0,module);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, const char* moduleId, IOTHUB_MODULE* module)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (moduleId == NULL) || (module == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if (module->version < IOTHUB_MODULE_VERSION_1 || module->version > IOTHUB_MODULE_VERSION_LATEST)
    {
        LogError("module must have a valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, moduleId, &deviceOrModuleInfo);
        if (deviceOrModuleInfo.moduleId == NULL)
        {
            result = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_module(&deviceOrModuleInfo, module);
        }
    }

    return result;
}